

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.cpp
# Opt level: O2

void __thiscall wasm::PassRunner::addDefaultFunctionOptimizationPasses(PassRunner *this)

{
  int iVar1;
  string *psVar2;
  string local_538;
  string local_518;
  string local_4f8;
  string local_4d8;
  string local_4b8;
  string local_498;
  string local_478;
  string local_458;
  string local_438;
  string local_418;
  string local_3f8;
  string local_3d8;
  string local_3b8;
  string local_398;
  string local_378;
  string local_358;
  string local_338;
  string local_318;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  string local_298;
  string local_278;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  allocator<char> local_11;
  
  if ((2 < (this->options).optimizeLevel) || (0 < (this->options).shrinkLevel)) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_538,"ssa-nomerge",&local_11)
    ;
    addIfNoDWARFIssues(this,&local_538);
    std::__cxx11::string::~string((string *)&local_538);
    if (3 < (this->options).optimizeLevel) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_518,"flatten",&local_11);
      addIfNoDWARFIssues(this,&local_518);
      std::__cxx11::string::~string((string *)&local_518);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4f8,"simplify-locals-notee-nostructure",&local_11);
      addIfNoDWARFIssues(this,&local_4f8);
      std::__cxx11::string::~string((string *)&local_4f8);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_4d8,"local-cse",&local_11)
      ;
      addIfNoDWARFIssues(this,&local_4d8);
      std::__cxx11::string::~string((string *)&local_4d8);
    }
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4b8,"dce",&local_11);
  addIfNoDWARFIssues(this,&local_4b8);
  std::__cxx11::string::~string((string *)&local_4b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_498,"remove-unused-names",&local_11);
  addIfNoDWARFIssues(this,&local_498);
  std::__cxx11::string::~string((string *)&local_498);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_478,"remove-unused-brs",&local_11);
  addIfNoDWARFIssues(this,&local_478);
  std::__cxx11::string::~string((string *)&local_478);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_458,"remove-unused-names",&local_11);
  addIfNoDWARFIssues(this,&local_458);
  std::__cxx11::string::~string((string *)&local_458);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_438,"optimize-instructions",&local_11);
  addIfNoDWARFIssues(this,&local_438);
  std::__cxx11::string::~string((string *)&local_438);
  if ((1 < (this->options).optimizeLevel) || (1 < (this->options).shrinkLevel)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_418,"pick-load-signs",&local_11);
    addIfNoDWARFIssues(this,&local_418);
    std::__cxx11::string::~string((string *)&local_418);
    if ((2 < (this->options).optimizeLevel) || (1 < (this->options).shrinkLevel)) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3f8,"precompute-propagate",&local_11);
      addIfNoDWARFIssues(this,&local_3f8);
      psVar2 = &local_3f8;
      goto LAB_007b0f03;
    }
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3d8,"precompute",&local_11);
  addIfNoDWARFIssues(this,&local_3d8);
  psVar2 = &local_3d8;
LAB_007b0f03:
  std::__cxx11::string::~string((string *)psVar2);
  if ((this->options).lowMemoryUnused == true) {
    if (((this->options).optimizeLevel < 3) && ((this->options).shrinkLevel < 1)) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_398,"optimize-added-constants",&local_11);
      addIfNoDWARFIssues(this,&local_398);
      psVar2 = &local_398;
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3b8,"optimize-added-constants-propagate",&local_11);
      addIfNoDWARFIssues(this,&local_3b8);
      psVar2 = &local_3b8;
    }
    std::__cxx11::string::~string((string *)psVar2);
  }
  if ((1 < (this->options).optimizeLevel) || (1 < (this->options).shrinkLevel)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_378,"code-pushing",&local_11);
    addIfNoDWARFIssues(this,&local_378);
    std::__cxx11::string::~string((string *)&local_378);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_358,"simplify-locals-nostructure",&local_11);
  addIfNoDWARFIssues(this,&local_358);
  std::__cxx11::string::~string((string *)&local_358);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_338,"vacuum",&local_11);
  addIfNoDWARFIssues(this,&local_338);
  std::__cxx11::string::~string((string *)&local_338);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_318,"reorder-locals",&local_11);
  addIfNoDWARFIssues(this,&local_318);
  std::__cxx11::string::~string((string *)&local_318);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2f8,"remove-unused-brs",&local_11);
  addIfNoDWARFIssues(this,&local_2f8);
  std::__cxx11::string::~string((string *)&local_2f8);
  iVar1 = (this->options).optimizeLevel;
  if ((1 < iVar1) && (((this->wasm->features).features & 0x400) != 0)) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d8,"heap2local",&local_11);
    addIfNoDWARFIssues(this,&local_2d8);
    std::__cxx11::string::~string((string *)&local_2d8);
    iVar1 = (this->options).optimizeLevel;
  }
  if ((2 < iVar1) || (1 < (this->options).shrinkLevel)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2b8,"merge-locals",&local_11);
    addIfNoDWARFIssues(this,&local_2b8);
    std::__cxx11::string::~string((string *)&local_2b8);
    iVar1 = (this->options).optimizeLevel;
  }
  if ((1 < iVar1) && (((this->wasm->features).features & 0x400) != 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_298,"optimize-casts",&local_11);
    addIfNoDWARFIssues(this,&local_298);
    std::__cxx11::string::~string((string *)&local_298);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_278,"local-subtyping",&local_11);
    addIfNoDWARFIssues(this,&local_278);
    std::__cxx11::string::~string((string *)&local_278);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_258,"coalesce-locals",&local_11);
  addIfNoDWARFIssues(this,&local_258);
  std::__cxx11::string::~string((string *)&local_258);
  if ((2 < (this->options).optimizeLevel) || (0 < (this->options).shrinkLevel)) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_238,"local-cse",&local_11);
    addIfNoDWARFIssues(this,&local_238);
    std::__cxx11::string::~string((string *)&local_238);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_218,"simplify-locals",&local_11);
  addIfNoDWARFIssues(this,&local_218);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f8,"vacuum",&local_11);
  addIfNoDWARFIssues(this,&local_1f8);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d8,"reorder-locals",&local_11);
  addIfNoDWARFIssues(this,&local_1d8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b8,"coalesce-locals",&local_11);
  addIfNoDWARFIssues(this,&local_1b8);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_198,"reorder-locals",&local_11);
  addIfNoDWARFIssues(this,&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_178,"vacuum",&local_11);
  addIfNoDWARFIssues(this,&local_178);
  std::__cxx11::string::~string((string *)&local_178);
  if ((2 < (this->options).optimizeLevel) || (0 < (this->options).shrinkLevel)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_158,"code-folding",&local_11);
    addIfNoDWARFIssues(this,&local_158);
    std::__cxx11::string::~string((string *)&local_158);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,"merge-blocks",&local_11);
  addIfNoDWARFIssues(this,&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"remove-unused-brs",&local_11);
  addIfNoDWARFIssues(this,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f8,"remove-unused-names",&local_11);
  addIfNoDWARFIssues(this,&local_f8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"merge-blocks",&local_11);
  addIfNoDWARFIssues(this,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  if (((this->options).optimizeLevel < 3) && ((this->options).shrinkLevel < 2)) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"precompute",&local_11);
    addIfNoDWARFIssues(this,&local_98);
    psVar2 = &local_98;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,"precompute-propagate",&local_11);
    addIfNoDWARFIssues(this,&local_b8);
    psVar2 = &local_b8;
  }
  std::__cxx11::string::~string((string *)psVar2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"optimize-instructions",&local_11);
  addIfNoDWARFIssues(this,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  if ((1 < (this->options).optimizeLevel) || (0 < (this->options).shrinkLevel)) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"rse",&local_11);
    addIfNoDWARFIssues(this,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"vacuum",&local_11);
  addIfNoDWARFIssues(this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void PassRunner::addDefaultFunctionOptimizationPasses() {
  // All the additions here are optional if DWARF must be preserved. That is,
  // when DWARF is relevant we run fewer optimizations.
  // FIXME: support DWARF in all of them.

  // Untangling to semi-ssa form is helpful (but best to ignore merges
  // so as to not introduce new copies).
  if (options.optimizeLevel >= 3 || options.shrinkLevel >= 1) {
    addIfNoDWARFIssues("ssa-nomerge");
  }
  // if we are willing to work very very hard, flatten the IR and do opts
  // that depend on flat IR
  if (options.optimizeLevel >= 4) {
    addIfNoDWARFIssues("flatten");
    // LocalCSE is particularly useful after flatten (see comment in the pass
    // itself), but we must simplify locals a little first (as flatten adds many
    // new and redundant ones, which make things seem different if we do not
    // run some amount of simplify-locals first).
    addIfNoDWARFIssues("simplify-locals-notee-nostructure");
    addIfNoDWARFIssues("local-cse");
    // TODO: add rereloop etc. here
  }
  addIfNoDWARFIssues("dce");
  addIfNoDWARFIssues("remove-unused-names");
  addIfNoDWARFIssues("remove-unused-brs");
  addIfNoDWARFIssues("remove-unused-names");
  addIfNoDWARFIssues("optimize-instructions");
  if (options.optimizeLevel >= 2 || options.shrinkLevel >= 2) {
    addIfNoDWARFIssues("pick-load-signs");
  }
  // early propagation
  if (options.optimizeLevel >= 3 || options.shrinkLevel >= 2) {
    addIfNoDWARFIssues("precompute-propagate");
  } else {
    addIfNoDWARFIssues("precompute");
  }
  if (options.lowMemoryUnused) {
    if (options.optimizeLevel >= 3 || options.shrinkLevel >= 1) {
      addIfNoDWARFIssues("optimize-added-constants-propagate");
    } else {
      addIfNoDWARFIssues("optimize-added-constants");
    }
  }
  if (options.optimizeLevel >= 2 || options.shrinkLevel >= 2) {
    addIfNoDWARFIssues("code-pushing");
  }
  // don't create if/block return values yet, as coalesce can remove copies that
  // that could inhibit
  addIfNoDWARFIssues("simplify-locals-nostructure");
  addIfNoDWARFIssues("vacuum"); // previous pass creates garbage
  addIfNoDWARFIssues("reorder-locals");
  // simplify-locals opens opportunities for optimizations
  addIfNoDWARFIssues("remove-unused-brs");
  if (options.optimizeLevel > 1 && wasm->features.hasGC()) {
    addIfNoDWARFIssues("heap2local");
  }
  // if we are willing to work hard, also optimize copies before coalescing
  if (options.optimizeLevel >= 3 || options.shrinkLevel >= 2) {
    addIfNoDWARFIssues("merge-locals"); // very slow on e.g. sqlite
  }
  if (options.optimizeLevel > 1 && wasm->features.hasGC()) {
    addIfNoDWARFIssues("optimize-casts");
    // Coalescing may prevent subtyping (as a coalesced local must have the
    // supertype of all those combined into it), so subtype first.
    // TODO: when optimizing for size, maybe the order should reverse?
    addIfNoDWARFIssues("local-subtyping");
  }
  addIfNoDWARFIssues("coalesce-locals");
  if (options.optimizeLevel >= 3 || options.shrinkLevel >= 1) {
    addIfNoDWARFIssues("local-cse");
  }
  addIfNoDWARFIssues("simplify-locals");
  addIfNoDWARFIssues("vacuum");
  addIfNoDWARFIssues("reorder-locals");
  addIfNoDWARFIssues("coalesce-locals");
  addIfNoDWARFIssues("reorder-locals");
  addIfNoDWARFIssues("vacuum");
  if (options.optimizeLevel >= 3 || options.shrinkLevel >= 1) {
    addIfNoDWARFIssues("code-folding");
  }
  addIfNoDWARFIssues("merge-blocks"); // makes remove-unused-brs more effective
  addIfNoDWARFIssues(
    "remove-unused-brs"); // coalesce-locals opens opportunities
  addIfNoDWARFIssues(
    "remove-unused-names");           // remove-unused-brs opens opportunities
  addIfNoDWARFIssues("merge-blocks"); // clean up remove-unused-brs new blocks
  // late propagation
  if (options.optimizeLevel >= 3 || options.shrinkLevel >= 2) {
    addIfNoDWARFIssues("precompute-propagate");
  } else {
    addIfNoDWARFIssues("precompute");
  }
  addIfNoDWARFIssues("optimize-instructions");
  if (options.optimizeLevel >= 2 || options.shrinkLevel >= 1) {
    addIfNoDWARFIssues(
      "rse"); // after all coalesce-locals, and before a final vacuum
  }
  addIfNoDWARFIssues("vacuum"); // just to be safe
}